

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionMatching.cpp
# Opt level: O0

int32_t get_gpr_store_offset_as_int(Instruction *instr)

{
  bool bVar1;
  int32_t iVar2;
  long in_RDI;
  Instruction *in_stack_00000018;
  
  bVar1 = is_gpr_store(in_stack_00000018);
  if (!bVar1) {
    __assert_fail("is_gpr_store(instr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                  ,0x107,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
  }
  if (*(char *)(in_RDI + 4) == '\x03') {
    iVar2 = InstructionAtom::get_imm((InstructionAtom *)instr);
    return iVar2;
  }
  __assert_fail("instr.n_src == 3",
                "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/Disasm/InstructionMatching.cpp"
                ,0x108,"int32_t get_gpr_store_offset_as_int(const Instruction &)");
}

Assistant:

int32_t get_gpr_store_offset_as_int(const Instruction& instr) {
  assert(is_gpr_store(instr));
  assert(instr.n_src == 3);
  return instr.src[1].get_imm();
}